

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::UseProgStagesCase::iterate(UseProgStagesCase *this)

{
  pointer *this_00;
  TestLog *pTVar1;
  RenderContext *pRVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLuint GVar6;
  uint uVar7;
  undefined4 extraout_var;
  TestError *pTVar9;
  GLSLVersion glslVersion;
  GLuint pipeline;
  GLuint progIdF;
  GLuint progIdV;
  GLint linkStatus;
  allocator<char> local_3f2;
  allocator<char> local_3f1;
  string fragNoMain;
  char *shaderSrc [1];
  string frag;
  string vtx;
  string local_388;
  string local_368;
  ShaderProgram progNoLink;
  ShaderProgram progVF;
  ProgramSources local_f8;
  long lVar8;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  vtx._M_dataplus._M_p = (pointer)&vtx.field_2;
  vtx._M_string_length = 0;
  frag._M_dataplus._M_p = (pointer)&frag.field_2;
  frag._M_string_length = 0;
  vtx.field_2._M_local_buf[0] = '\0';
  frag.field_2._M_local_buf[0] = '\0';
  generateBasicVertexSrc_abi_cxx11_
            ((string *)&progVF,(glcts *)(ulong)this->m_glslVersion,GLSL_VERSION_100_ES);
  std::__cxx11::string::operator=((string *)&vtx,(string *)&progVF);
  std::__cxx11::string::~string((string *)&progVF);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)&progVF,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&frag,(string *)&progVF);
  std::__cxx11::string::~string((string *)&progVF);
  this_00 = &progVF.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  progVF.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Begin:UseProgStagesCase iterate");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&progVF,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (**(code **)(lVar8 + 0x6d8))(1,&pipeline);
  (**(code **)(lVar8 + 0x98))(pipeline);
  GVar4 = (**(code **)(lVar8 + 0x3f8))(0x8b31,1);
  (**(code **)(lVar8 + 0x1688))(pipeline,1,GVar4);
  (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b31,&progIdV);
  (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b30,&progIdF);
  if (((GVar4 == 0) || (progIdV != GVar4)) || (progIdF != 0)) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2cd);
  }
  else {
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"UseProgramStages failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                    ,0x2cf);
    GVar6 = (**(code **)(lVar8 + 0x3f8))(0x8b30,1);
    (**(code **)(lVar8 + 0x1688))(pipeline,2,GVar6);
    (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b30,&progIdF);
    if (((GVar6 == 0) || (progIdF != GVar6)) || (progIdF == progIdV)) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"UseProgramStages failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x2d9);
    }
    else {
      (**(code **)(lVar8 + 0x1688))(pipeline,3,0);
      (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b31,&progIdV);
      (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b30,&progIdF);
      if (progIdF == 0 && progIdV == 0) {
        pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,vtx._M_dataplus._M_p,(allocator<char> *)&local_368);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragNoMain,frag._M_dataplus._M_p,(allocator<char> *)&local_388);
        glu::makeVtxFragSources((ProgramSources *)&progNoLink,(string *)&local_f8,&fragNoMain);
        glu::ShaderProgram::ShaderProgram(&progVF,pRVar2,(ProgramSources *)&progNoLink);
        glu::ProgramSources::~ProgramSources((ProgramSources *)&progNoLink);
        std::__cxx11::string::~string((string *)&fragNoMain);
        std::__cxx11::string::~string((string *)&local_f8);
        (**(code **)(lVar8 + 0x1058))(progVF.m_program.m_program,0x8258,1);
        (**(code **)(lVar8 + 0xce8))(progVF.m_program.m_program);
        (**(code **)(lVar8 + 0x9d8))(progVF.m_program.m_program,0x8b82,&linkStatus);
        if (linkStatus == 1) {
          dVar5 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar5,"UseProgramStages failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0x2f0);
          (**(code **)(lVar8 + 0x1688))(pipeline,3,progVF.m_program.m_program);
          (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b31,&progIdV);
          (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b30,&progIdF);
          if ((progIdV == progVF.m_program.m_program) && (progIdV == progIdF)) {
            dVar5 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar5,"UseProgramStages failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                            ,0x2f9);
            (**(code **)(lVar8 + 0x1688))(pipeline,3,0);
            (**(code **)(lVar8 + 0x1688))(pipeline,1,GVar6);
            dVar5 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar5,"UseProgramStages failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                            ,0x2fe);
            (**(code **)(lVar8 + 0x98))(0);
            (**(code **)(lVar8 + 0x450))(1,&pipeline);
            pipeline = 0;
            (**(code **)(lVar8 + 0x6d8))(1);
            (**(code **)(lVar8 + 0x1688))(pipeline,1,GVar4);
            (**(code **)(lVar8 + 0x1688))(pipeline,2,GVar6);
            (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b31,&progIdV);
            (**(code **)(lVar8 + 0x9a0))(pipeline,0x8b30,&progIdF);
            if ((progIdV == GVar4) && (progIdF == GVar6)) {
              dVar5 = (**(code **)(lVar8 + 0x800))();
              glu::checkError(dVar5,"UseProgramStages failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                              ,0x30d);
              (**(code **)(lVar8 + 0x1688))(pipeline,0xfffffffffffffffc,GVar4);
              iVar3 = (**(code **)(lVar8 + 0x800))();
              if (iVar3 == 0x501) {
                (**(code **)(lVar8 + 0x1058))(progVF.m_program.m_program,0x8258,0);
                (**(code **)(lVar8 + 0xce8))(progVF.m_program.m_program);
                (**(code **)(lVar8 + 0x9d8))(progVF.m_program.m_program,0x8b82,&linkStatus);
                if (linkStatus == 1) {
                  dVar5 = (**(code **)(lVar8 + 0x800))();
                  glu::checkError(dVar5,"UseProgramStages failed",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                  ,0x321);
                  (**(code **)(lVar8 + 0x1688))(pipeline,3,progVF.m_program.m_program);
                  iVar3 = (**(code **)(lVar8 + 0x800))();
                  if (iVar3 == 0x502) {
                    std::__cxx11::string::string((string *)&fragNoMain,(string *)&frag);
                    uVar7 = std::__cxx11::string::find((char *)&fragNoMain,0x1738688);
                    std::__cxx11::string::replace((ulong)&fragNoMain,(ulong)uVar7,&DAT_00000004);
                    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_368,vtx._M_dataplus._M_p,&local_3f1);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_388,fragNoMain._M_dataplus._M_p,&local_3f2);
                    glu::makeVtxFragSources(&local_f8,&local_368,&local_388);
                    glu::ShaderProgram::ShaderProgram(&progNoLink,pRVar2,&local_f8);
                    glu::ProgramSources::~ProgramSources(&local_f8);
                    std::__cxx11::string::~string((string *)&local_388);
                    std::__cxx11::string::~string((string *)&local_368);
                    (**(code **)(lVar8 + 0x1058))(progNoLink.m_program.m_program,0x8258,1);
                    (**(code **)(lVar8 + 0xce8))(progNoLink.m_program.m_program);
                    (**(code **)(lVar8 + 0x1688))(pipeline,3,progNoLink.m_program.m_program);
                    iVar3 = (**(code **)(lVar8 + 0x800))();
                    if (iVar3 == 0x502) {
                      (**(code **)(lVar8 + 0x1688))(pipeline + 1000,1,GVar4);
                      iVar3 = (**(code **)(lVar8 + 0x800))();
                      if (iVar3 == 0x502) {
                        (**(code **)(lVar8 + 0x450))(1,&pipeline);
                        (**(code **)(lVar8 + 0x1688))(pipeline,1,GVar4);
                        iVar3 = (**(code **)(lVar8 + 0x800))();
                        if (iVar3 == 0x502) {
                          (**(code **)(lVar8 + 0x448))(GVar4);
                          (**(code **)(lVar8 + 0x448))(GVar6);
                          tcu::TestContext::setTestResult
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                                     QP_TEST_RESULT_PASS,"Pass");
                          glu::ShaderProgram::~ShaderProgram(&progNoLink);
                          std::__cxx11::string::~string((string *)&fragNoMain);
                          glu::ShaderProgram::~ShaderProgram(&progVF);
                          std::__cxx11::string::~string((string *)&frag);
                          std::__cxx11::string::~string((string *)&vtx);
                          return STOP;
                        }
                        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar9,"UseProgramStages failed",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                   ,0x348);
                      }
                      else {
                        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar9,"UseProgramStages failed",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                   ,0x33f);
                      }
                    }
                    else {
                      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar9,"UseProgramStages failed",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x337);
                    }
                    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar9,"UseProgramStages failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x326);
                }
                else {
                  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar9,"UseProgramStages failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,799);
                }
              }
              else {
                pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar9,"UseProgramStages failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x316);
              }
            }
            else {
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,"UseProgramStages failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x30b);
            }
          }
          else {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"UseProgramStages failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x2f7);
          }
        }
        else {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"UseProgramStages failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x2ee);
        }
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"UseProgramStages failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x2e2);
    }
  }
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		glw::GLenum			  err;
		glw::GLuint			  pipeline;
		glw::GLuint			  progIdV, progIdF;
		glw::GLuint			  programVtx, programFrag;
		const char*			  shaderSrc[1];
		std::string			  vtx;
		std::string			  frag;
		glw::GLint			  linkStatus;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// UseProgramStages verification
		log << TestLog::Message << "Begin:UseProgStagesCase iterate" << TestLog::EndMessage;

		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		// Use Vertex Shader
		shaderSrc[0] = vtx.c_str();
		programVtx   = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programVtx == 0) || (progIdV != programVtx) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use Fragment Shader
		shaderSrc[0] = frag.c_str();
		programFrag  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programFrag == 0) || (progIdF != programFrag) || (progIdF == progIdV))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Reset stages
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != 0) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// One program for both.
		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		// Make separable and relink
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != progVF.getProgram()) || (progIdV != progIdF))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use a fragment program with vertex bit
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programFrag);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Unbound pipeline
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);
		pipeline = 0;
		gl.genProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != programVtx) || (progIdF != programFrag))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Negative Cases

		// Invalid stages
		gl.useProgramStages(pipeline, GL_ALL_SHADER_BITS ^ (GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT), programVtx);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not separable
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not successfully linked
		// remove the main keyword
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));

		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progNoLink.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.useProgramStages(pipeline + 1000, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.deleteProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		gl.deleteProgram(programVtx);
		gl.deleteProgram(programFrag);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}